

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::push_back(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *val)

{
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  string *unaff_retaddr;
  int in_stack_0000000c;
  value_type *in_stack_ffffffffffffff78;
  char *__lhs;
  bool local_71;
  json_value local_70;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  value_t in_stack_ffffffffffffffbf;
  json_value *in_stack_ffffffffffffffc0;
  
  bVar1 = is_null(in_RDI);
  local_71 = true;
  if (!bVar1) {
    local_71 = is_array(in_RDI);
  }
  if (((local_71 ^ 0xffU) & 1) != 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_name(in_RDI);
    __lhs = &stack0xffffffffffffffaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::operator+(__lhs,__rhs);
    detail::type_error::create(in_stack_0000000c,unaff_retaddr);
    __cxa_throw(uVar2,&detail::type_error::typeinfo,detail::type_error::~type_error);
  }
  bVar1 = is_null(in_RDI);
  if (bVar1) {
    in_RDI->m_type = array;
    json_value::json_value(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    in_RDI->m_value = local_70;
    assert_invariant(in_RDI);
  }
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::push_back((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               *)in_RDI,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void push_back(const basic_json& val)
{
// push_back only works for null objects or arrays
if (JSON_UNLIKELY(not(is_null() or is_array())))
{
JSON_THROW(type_error::create(308, "cannot use push_back() with " + std::string(type_name())));
}

// transform null object into an array
if (is_null())
{
m_type = value_t::array;
m_value = value_t::array;
assert_invariant();
}

// add element to array
m_value.array->push_back(val);
}